

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizard::restart(QWizard *this)

{
  QWizardPrivate *this_00;
  
  this_00 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QWizardPrivate::disableUpdates(this_00);
  QWizardPrivate::reset(this_00);
  QWizardPrivate::switchToPage
            (this_00,*(int *)(*(long *)&(this->super_QDialog).super_QWidget.field_0x8 + 0x338),
             Forward);
  QWizardPrivate::enableUpdates(this_00);
  return;
}

Assistant:

void QWizard::restart()
{
    Q_D(QWizard);
    d->disableUpdates();
    d->reset();
    d->switchToPage(startId(), QWizardPrivate::Forward);
    d->enableUpdates();
}